

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_estimateCCtxSize_usingCCtxParams(ZSTD_CCtx_params *params)

{
  size_t sVar1;
  ZSTD_useRowMatchFinderMode_e useRowMatchFinder;
  ZSTD_compressionParameters cParams;
  
  sVar1 = 0xffffffffffffffff;
  ZSTD_getCParamsFromCCtxParams(&cParams,params,0xffffffffffffffff,0,ZSTD_cpm_noAttachDict);
  useRowMatchFinder = params->useRowMatchFinder;
  if (useRowMatchFinder == ZSTD_urm_auto) {
    if (cParams.strategy - ZSTD_btlazy2 < 0xfffffffd) {
      useRowMatchFinder = ZSTD_urm_disableRowMatchFinder;
    }
    else {
      useRowMatchFinder = ZSTD_urm_enableRowMatchFinder - (cParams.windowLog < 0xf);
    }
  }
  if (params->nbWorkers < 1) {
    sVar1 = ZSTD_estimateCCtxSize_usingCCtxParams_internal
                      (&cParams,&params->ldmParams,1,useRowMatchFinder,0,0,0xffffffffffffffff);
  }
  return sVar1;
}

Assistant:

size_t ZSTD_estimateCCtxSize_usingCCtxParams(const ZSTD_CCtx_params* params)
{
    ZSTD_compressionParameters const cParams =
                ZSTD_getCParamsFromCCtxParams(params, ZSTD_CONTENTSIZE_UNKNOWN, 0, ZSTD_cpm_noAttachDict);
    ZSTD_useRowMatchFinderMode_e const useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(params->useRowMatchFinder,
                                                                                         &cParams);

    RETURN_ERROR_IF(params->nbWorkers > 0, GENERIC, "Estimate CCtx size is supported for single-threaded compression only.");
    /* estimateCCtxSize is for one-shot compression. So no buffers should
     * be needed. However, we still allocate two 0-sized buffers, which can
     * take space under ASAN. */
    return ZSTD_estimateCCtxSize_usingCCtxParams_internal(
        &cParams, &params->ldmParams, 1, useRowMatchFinder, 0, 0, ZSTD_CONTENTSIZE_UNKNOWN);
}